

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O3

Vec_Int_t * Wlc_NtkCollectOneType(Wlc_Ntk_t *p,Vec_Int_t *vMemObjsClean,int Type1,int Type2)

{
  int Entry;
  int iVar1;
  Vec_Int_t *p_00;
  int *piVar2;
  uint uVar3;
  long lVar4;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar2 = (int *)malloc(400);
  p_00->pArray = piVar2;
  iVar1 = vMemObjsClean->nSize;
  if (0 < iVar1) {
    lVar4 = 0;
    do {
      Entry = vMemObjsClean->pArray[lVar4];
      if (((long)Entry < 1) || (p->nObjsAlloc <= Entry)) {
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      uVar3 = *(ushort *)(p->pObjs + Entry) & 0x3f;
      if (uVar3 == Type1 || uVar3 == Type2) {
        Vec_IntPush(p_00,Entry);
        iVar1 = vMemObjsClean->nSize;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar1);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Wlc_NtkCollectOneType( Wlc_Ntk_t * p, Vec_Int_t * vMemObjsClean, int Type1, int Type2 )
{
    Wlc_Obj_t * pObj; int i;
    Vec_Int_t * vRes = Vec_IntAlloc( 100 );
    Wlc_NtkForEachObjVec( vMemObjsClean, p, pObj, i )
        if ( Wlc_ObjType(pObj) == Type1 || Wlc_ObjType(pObj) == Type2 )
            Vec_IntPush( vRes, Wlc_ObjId(p, pObj) );
    return vRes;
}